

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O2

bool __thiscall GraphBuilder::matchForksAndJoins(GraphBuilder *this)

{
  JoinNode *this_00;
  undefined8 *puVar1;
  Node *node;
  type *forkNode;
  FunctionGraph *this_01;
  ExitNode *exitNode;
  bool bVar2;
  __node_base *p_Var3;
  undefined8 *puVar4;
  ForkJoinAnalysis FJA;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> functions;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> llvmforks;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_48;
  undefined8 *local_40;
  
  p_Var3 = &(this->llvmToJoins_)._M_h._M_before_begin;
  bVar2 = false;
  while( true ) {
    p_Var3 = p_Var3->_M_nxt;
    if (p_Var3 == (__node_base *)0x0) break;
    this_00 = *(JoinNode **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
    dg::ForkJoinAnalysis::matchJoin((Value *)&local_48);
    puVar1 = local_40;
    for (puVar4 = local_48; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      node = findInstruction(this,(Instruction *)*puVar4);
      forkNode = castNode<(NodeType)1,Node>(node);
      if (forkNode != (type *)0x0) {
        JoinNode::addCorrespondingFork(this_00,forkNode);
        bVar2 = true;
      }
    }
    dg::ForkJoinAnalysis::joinFunctions((Value *)&local_60);
    puVar1 = local_58;
    for (puVar4 = local_60; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      this_01 = findFunction(this,(Function *)*puVar4);
      if (this_01 != (FunctionGraph *)0x0) {
        exitNode = FunctionGraph::exitNode(this_01);
        JoinNode::addJoinPredecessor(this_00,exitNode);
        bVar2 = true;
      }
    }
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&local_60)
    ;
    std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
              ((_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)&local_48)
    ;
  }
  return bVar2;
}

Assistant:

bool GraphBuilder::matchForksAndJoins() {
    using namespace llvm;
    bool changed = false;

    ForkJoinAnalysis FJA{pointsToAnalysis_};

    for (auto &it : llvmToJoins_) {
        // it.first -> llvm::CallInst, it.second -> RWNode *
        auto *joinNode = it.second;
        auto llvmforks = FJA.matchJoin(it.first);
        for (const auto *forkcall : llvmforks) {
            auto *foundInstruction =
                    findInstruction(cast<Instruction>(forkcall));
            auto *forkNode = castNode<NodeType::FORK>(foundInstruction);
            if (forkNode) {
                changed |= true;
                joinNode->addCorrespondingFork(forkNode);
            }
        }

        auto functions = FJA.joinFunctions(it.first);
        for (const auto *llvmFunction : functions) {
            auto *functionGraph = findFunction(cast<Function>(llvmFunction));
            if (functionGraph) {
                joinNode->addJoinPredecessor(functionGraph->exitNode());
                changed |= true;
            }
        }
    }

    return changed;
}